

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

bool __thiscall vkt::memory::anon_unknown_0::MemoryTestInstance::prepare(MemoryTestInstance *this)

{
  size_type *psVar1;
  MovePtr<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
  *this_00;
  TestLog *log;
  Memory *pMVar2;
  long *plVar3;
  undefined8 *puVar4;
  PrepareContext *pPVar5;
  pointer ppCVar6;
  long *plVar7;
  ulong *puVar8;
  ulong uVar9;
  ScopedLogSection section;
  ulong *local_2f0;
  long local_2e8;
  ulong local_2e0;
  long lStack_2d8;
  string local_2d0;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  string local_290;
  ulong *local_270;
  long local_268;
  ulong local_260 [2];
  ulong *local_250;
  long local_248;
  ulong local_240;
  long lStack_238;
  long *local_230 [2];
  long local_220 [2];
  ScopedLogSection local_210;
  ulong *local_208;
  long local_200;
  ulong local_1f8 [2];
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  UniqueBase<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
  local_1a8 [7];
  ios_base local_138 [264];
  
  log = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_230,0,(char *)0x0,0xb2a4de);
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_2a0 = *plVar7;
    lStack_298 = plVar3[3];
    local_2b0 = &local_2a0;
  }
  else {
    local_2a0 = *plVar7;
    local_2b0 = (long *)*plVar3;
  }
  local_2a8 = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  puVar8 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar8) {
    local_2e0 = *puVar8;
    lStack_2d8 = plVar3[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0 = *puVar8;
    local_2f0 = (ulong *)*plVar3;
  }
  local_2e8 = plVar3[1];
  *plVar3 = (long)puVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar9 = 0xf;
  if (local_2f0 != &local_2e0) {
    uVar9 = local_2e0;
  }
  if (uVar9 < (ulong)(local_268 + local_2e8)) {
    uVar9 = 0xf;
    if (local_270 != local_260) {
      uVar9 = local_260[0];
    }
    if (uVar9 < (ulong)(local_268 + local_2e8)) goto LAB_0066a6c8;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_2f0);
  }
  else {
LAB_0066a6c8:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_270);
  }
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  psVar1 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_2d0.field_2._M_allocated_capacity = *psVar1;
    local_2d0.field_2._8_8_ = puVar4[3];
  }
  else {
    local_2d0.field_2._M_allocated_capacity = *psVar1;
    local_2d0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_2d0._M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0xb2daa7);
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_1d8 = *plVar7;
    lStack_1d0 = plVar3[3];
    local_1e8 = &local_1d8;
  }
  else {
    local_1d8 = *plVar7;
    local_1e8 = (long *)*plVar3;
  }
  local_1e0 = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  puVar8 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar8) {
    local_240 = *puVar8;
    lStack_238 = plVar3[3];
    local_250 = &local_240;
  }
  else {
    local_240 = *puVar8;
    local_250 = (ulong *)*plVar3;
  }
  local_248 = plVar3[1];
  *plVar3 = (long)puVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar9 = 0xf;
  if (local_250 != &local_240) {
    uVar9 = local_240;
  }
  if (uVar9 < (ulong)(local_200 + local_248)) {
    uVar9 = 0xf;
    if (local_208 != local_1f8) {
      uVar9 = local_1f8[0];
    }
    if ((ulong)(local_200 + local_248) <= uVar9) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_250);
      goto LAB_0066a927;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_208);
LAB_0066a927:
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  psVar1 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_290.field_2._M_allocated_capacity = *psVar1;
    local_290.field_2._8_8_ = puVar4[3];
  }
  else {
    local_290.field_2._M_allocated_capacity = *psVar1;
    local_290._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_290._M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  tcu::ScopedLogSection::ScopedLogSection(&local_210,log,&local_2d0,&local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if (local_208 != local_1f8) {
    operator_delete(local_208,local_1f8[0] + 1);
  }
  if (local_250 != &local_240) {
    operator_delete(local_250,local_240 + 1);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,local_1d8 + 1);
  }
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if (local_270 != local_260) {
    operator_delete(local_270,local_260[0] + 1);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,local_2e0 + 1);
  }
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0,local_2a0 + 1);
  }
  if (local_230[0] != local_220) {
    operator_delete(local_230[0],local_220[0] + 1);
  }
  pPVar5 = (PrepareContext *)operator_new(0x70);
  pMVar2 = (this->m_memory).
           super_UniqueBase<vkt::memory::(anonymous_namespace)::Memory,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Memory>_>
           .m_data.ptr;
  pPVar5->m_context =
       (this->m_renderContext).
       super_UniqueBase<vkt::memory::(anonymous_namespace)::Context,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Context>_>
       .m_data.ptr;
  pPVar5->m_memory = pMVar2;
  (pPVar5->m_currentBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       0;
  (pPVar5->m_currentBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (pPVar5->m_currentBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (pPVar5->m_currentBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)0x0;
  (pPVar5->m_currentImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       0;
  (pPVar5->m_currentImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (pPVar5->m_currentImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (pPVar5->m_currentImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)0x0;
  local_1a8[0].m_data.ptr = (PrepareContext *)0x0;
  this_00 = &this->m_prepareContext;
  if ((this->m_prepareContext).
      super_UniqueBase<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
      .m_data.ptr != pPVar5) {
    de::details::
    UniqueBase<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
    ::reset(&this_00->
             super_UniqueBase<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
           );
    (this_00->
    super_UniqueBase<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
    ).m_data.ptr = pPVar5;
  }
  de::details::
  UniqueBase<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
  ::reset(local_1a8);
  local_290._M_dataplus._M_p = (pointer)0x0;
  ppCVar6 = (this->m_commands).
            super__Vector_base<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_commands).
      super__Vector_base<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppCVar6) {
    do {
      (*ppCVar6[(long)local_290._M_dataplus._M_p]->_vptr_Command[5])
                (ppCVar6[(long)local_290._M_dataplus._M_p],
                 (this_00->
                 super_UniqueBase<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
                 ).m_data.ptr);
      local_290._M_dataplus._M_p = local_290._M_dataplus._M_p + 1;
      ppCVar6 = (this->m_commands).
                super__Vector_base<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (local_290._M_dataplus._M_p <
             (pointer)((long)(this->m_commands).
                             super__Vector_base<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar6 >> 3));
  }
  this->m_stage = (StageFunc)execute;
  *(undefined8 *)&this->field_0x258 = 0;
  tcu::TestLog::endSection(local_210.m_log);
  return true;
}

Assistant:

bool MemoryTestInstance::prepare (void)
{
	TestLog&					log		= m_context.getTestContext().getLog();
	const tcu::ScopedLogSection	section	(log, "MemoryType" + de::toString(m_memoryTypeNdx) + "Prepare" + de::toString(m_iteration),
											  "Memory type " + de::toString(m_memoryTypeNdx) + " prepare iteration" + de::toString(m_iteration));

	m_prepareContext = MovePtr<PrepareContext>(new PrepareContext(*m_renderContext, *m_memory));

	DE_ASSERT(!m_commands.empty());

	for (size_t cmdNdx = 0; cmdNdx < m_commands.size(); cmdNdx++)
	{
		Command& command = *m_commands[cmdNdx];

		try
		{
			command.prepare(*m_prepareContext);
		}
		catch (const tcu::TestError& e)
		{
			m_resultCollector.fail(de::toString(cmdNdx) + ":" + command.getName() + " failed to prepare, got exception: " + string(e.getMessage()));
			return nextMemoryType();
		}
	}

	m_stage = &MemoryTestInstance::execute;
	return true;
}